

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.c
# Opt level: O0

void tred2(double *a,int N,double *d,double *e)

{
  double dVar1;
  int iVar2;
  int iVar3;
  double dVar4;
  double local_68;
  double local_60;
  double f;
  double g;
  double h;
  double hh;
  double scale;
  int i;
  int j;
  int k;
  int l;
  double *e_local;
  double *d_local;
  int N_local;
  double *a_local;
  
  for (scale._0_4_ = N + -1; 0 < scale._0_4_; scale._0_4_ = scale._0_4_ + -1) {
    iVar2 = scale._0_4_ + -1;
    hh = 0.0;
    g = 0.0;
    if (iVar2 < 1) {
      e[scale._0_4_] = a[scale._0_4_ * N + iVar2];
    }
    else {
      for (i = 0; i <= iVar2; i = i + 1) {
        hh = ABS(a[scale._0_4_ * N + i]) + hh;
      }
      if ((hh != 0.0) || (NAN(hh))) {
        for (i = 0; i <= iVar2; i = i + 1) {
          iVar3 = scale._0_4_ * N + i;
          a[iVar3] = a[iVar3] / hh;
          g = a[scale._0_4_ * N + i] * a[scale._0_4_ * N + i] + g;
        }
        dVar1 = a[scale._0_4_ * N + iVar2];
        if (dVar1 < 0.0) {
          local_68 = sqrt(g);
        }
        else {
          local_68 = sqrt(g);
          local_68 = -local_68;
        }
        e[scale._0_4_] = hh * local_68;
        g = -dVar1 * local_68 + g;
        a[scale._0_4_ * N + iVar2] = dVar1 - local_68;
        local_60 = 0.0;
        for (scale._4_4_ = 0; scale._4_4_ <= iVar2; scale._4_4_ = scale._4_4_ + 1) {
          a[scale._4_4_ * N + scale._0_4_] = a[scale._0_4_ * N + scale._4_4_] / g;
          f = 0.0;
          for (i = 0; iVar3 = scale._4_4_, i <= scale._4_4_; i = i + 1) {
            f = a[scale._4_4_ * N + i] * a[scale._0_4_ * N + i] + f;
          }
          while (i = iVar3 + 1, i <= iVar2) {
            f = a[i * N + scale._4_4_] * a[scale._0_4_ * N + i] + f;
            iVar3 = i;
          }
          e[scale._4_4_] = f / g;
          local_60 = e[scale._4_4_] * a[scale._0_4_ * N + scale._4_4_] + local_60;
        }
        for (scale._4_4_ = 0; scale._4_4_ <= iVar2; scale._4_4_ = scale._4_4_ + 1) {
          dVar1 = a[scale._0_4_ * N + scale._4_4_];
          dVar4 = -(local_60 / (g + g)) * dVar1 + e[scale._4_4_];
          e[scale._4_4_] = dVar4;
          for (i = 0; i <= scale._4_4_; i = i + 1) {
            iVar3 = scale._4_4_ * N + i;
            a[iVar3] = a[iVar3] - (dVar1 * e[i] + dVar4 * a[scale._0_4_ * N + i]);
          }
        }
      }
      else {
        e[scale._0_4_] = a[scale._0_4_ * N + iVar2];
      }
    }
    d[scale._0_4_] = g;
  }
  *d = 0.0;
  *e = 0.0;
  for (scale._0_4_ = 0; scale._0_4_ < N; scale._0_4_ = scale._0_4_ + 1) {
    iVar2 = scale._0_4_ + -1;
    if ((d[scale._0_4_] != 0.0) || (NAN(d[scale._0_4_]))) {
      for (scale._4_4_ = 0; scale._4_4_ <= iVar2; scale._4_4_ = scale._4_4_ + 1) {
        f = 0.0;
        for (i = 0; i <= iVar2; i = i + 1) {
          f = a[scale._0_4_ * N + i] * a[i * N + scale._4_4_] + f;
        }
        for (i = 0; i <= iVar2; i = i + 1) {
          iVar3 = i * N + scale._4_4_;
          a[iVar3] = -f * a[i * N + scale._0_4_] + a[iVar3];
        }
      }
    }
    d[scale._0_4_] = a[scale._0_4_ * N + scale._0_4_];
    a[scale._0_4_ * N + scale._0_4_] = 1.0;
    for (scale._4_4_ = 0; scale._4_4_ <= iVar2; scale._4_4_ = scale._4_4_ + 1) {
      a[scale._0_4_ * N + scale._4_4_] = 0.0;
      a[scale._4_4_ * N + scale._0_4_] = 0.0;
    }
  }
  return;
}

Assistant:

static void tred2(double *a, int N, double *d, double *e) {
	// Modified version of Numerical recipes tred2 alogorithm
	int l, k, j, i;
	double scale, hh, h, g, f;

	for (i = N - 1; i > 0; --i) {
		l = i - 1;
		h = scale = 0.0;

		if (l > 0) {
			for (k = 0; k <= l; ++k) {
				scale +=(double) fabs(a[i*N + k]);
			}
			if (scale == 0.0) {
				e[i] = a[i*N + l];
			}
			else {
				for (k = 0; k <= l; ++k) {
					a[i*N + k] /= scale;
					h += a[i*N + k] * a[i*N + k];
				}
				f = a[i*N + l];
				g = (double) (f >= 0.0 ? -sqrt(h) : sqrt(h));
				e[i] = scale*g;
				h -= f*g;
				a[i*N + l] = f - g;
				f = 0.0;

				for (j = 0; j <= l; ++j) {
					a[j*N + i] = a[i*N + j] / h;
					g = 0.0;
					for (k = 0; k <= j; ++k) {
						g += a[j*N + k] * a[i*N + k];
					}
					for (k = j + 1; k <= l; ++k) {
						g += a[k*N + j] * a[i*N + k];
					}
					e[j] = g / h;
					f += e[j] * a[i*N + j];
				}
				hh = f / (h + h);
				for (j = 0; j <= l; ++j) {
					f = a[i*N + j];
					e[j] = g = e[j] - hh*f;
					for (k = 0; k <= j; ++k) {
						a[j*N + k] -= (f*e[k] + g*a[i*N + k]);
					}
				}
			}

		}
		else {
			e[i] = a[i*N + l];
		}
		d[i] = h;
	}

	d[0] = 0.0;
	e[0] = 0.0;

	for (i = 0; i < N; ++i) {
		l = i - 1;
		if (d[i]) {
			for (j = 0; j <= l; ++j) {
				g = 0.0;
				for (k = 0; k <= l; ++k) {
					g += a[i*N+k] * a[k*N+j];
				}
				for (k = 0; k <= l; ++k) {
					a[k*N + j] -= g*a[k*N+i];
				}
			}
		}
		d[i] = a[i*N+i];
		a[i*N+i] = 1.0;
		for (j = 0; j <= l; ++j) {
			a[j*N+i] = a[i*N+j] = 0.0;
		}
	}
}